

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O3

void __thiscall TimerTest_scoped_Test::TestBody(TimerTest_scoped_Test *this)

{
  undefined8 uVar1;
  char *pcVar2;
  size_t iterations;
  timer timer_obj;
  promise<void> promise;
  duration<long,_std::ratio<1L,_1000000000L>_> local_90;
  __basic_future<void> local_88;
  internal local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  undefined8 local_68;
  future_status local_60;
  future_status local_5c;
  long *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  timer local_30;
  promise<void> local_20;
  
  local_68 = 0;
  std::promise<void>::promise(&local_20);
  local_58 = (long *)0x0;
  uStack_50 = 0;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58 = (long *)operator_new(0x18);
  *local_58 = (long)&local_68;
  local_58[1] = (long)&local_20;
  local_58[2] = (long)&local_30;
  pcStack_40 = std::
               _Function_handler<void_(jessilib::timer_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp:56:27)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(jessilib::timer_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp:56:27)>
             ::_M_manager;
  jessilib::timer::timer(&local_30,1000000);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  std::__basic_future<void>::__basic_future(&local_88,&local_20._M_future);
  local_90.__r = 0x5bad54318000;
  if (local_88._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_State_baseV2 *)0x0) {
    local_5c = std::__future_base::_State_baseV2::wait_for<long,std::ratio<1l,1000000000l>>
                         (local_88._M_state.
                          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,&local_90);
    local_60 = ready;
    testing::internal::CmpHelperEQ<std::future_status,std::future_status>
              (local_78,"promise.get_future().wait_for(timeout * 100000)",
               "std::future_status::ready",&local_5c,&local_60);
    if (local_88._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_70->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp"
                 ,0x41,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (_State_baseV2 *)0x0) {
        (*(local_88._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->_vptr__State_baseV2[1])();
      }
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
    if (local_30.m_context.
        super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.m_context.
                 super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::promise<void>::~promise(&local_20);
    return;
  }
  uVar1 = std::__throw_future_error(3);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
  if (local_88._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_State_baseV2 *)0x0) {
    (*(local_88._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr__State_baseV2[1])();
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  if (local_30.m_context.
      super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.m_context.
               super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<void>::~promise(&local_20);
  _Unwind_Resume(uVar1);
}

Assistant:

TEST(TimerTest, scoped) {
	size_t iterations{ 0 };
	std::promise<void> promise;

	timer timer_obj{ period, [&iterations, &promise, &timer_obj](timer& in_timer) {
		EXPECT_EQ(timer_obj, in_timer);

		if (++iterations == total_iterations) {
			promise.set_value();
			in_timer.cancel();
		}
	} };

	EXPECT_EQ(promise.get_future().wait_for(timeout * 100000), std::future_status::ready);
}